

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SquareMatrix.hpp
# Opt level: O2

void __thiscall
qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
          (SquareMatrix<std::complex<float>_> *this,complex<float> m00,complex<float> m01,
          complex<float> m10,complex<float> m11)

{
  undefined4 in_XMM0_Da;
  undefined4 in_XMM0_Db;
  _ComplexT in_XMM1_Qa;
  _ComplexT in_XMM2_Qa;
  _ComplexT in_XMM3_Qa;
  
  this->size_ = 2;
  alloc_unique_array<std::complex<float>>((dense *)&this->data_,4);
  ((this->data_)._M_t.
   super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t.
   super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
   super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl)->_M_value =
       CONCAT44(in_XMM0_Db,in_XMM0_Da);
  (this->data_)._M_t.
  super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t.
  super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
  super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl[1]._M_value = in_XMM2_Qa;
  (this->data_)._M_t.
  super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t.
  super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
  super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl[2]._M_value = in_XMM1_Qa;
  (this->data_)._M_t.
  super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t.
  super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
  super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl[3]._M_value = in_XMM3_Qa;
  return;
}

Assistant:

SquareMatrix( const T m00 , const T m01 ,
                      const T m10 , const T m11 )
        : size_( 2 )
        , data_( alloc_unique_array< T >( 4 ) )
        {
          data_[0] = m00 ; data_[1] = m10 ;
          data_[2] = m01 ; data_[3] = m11 ;
        }